

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O2

nvpair_t * nvpair_move_descriptor(char *name,int value)

{
  int iVar1;
  _Bool _Var2;
  nvpair_t *pnVar3;
  int *piVar4;
  
  if (-1 < value) {
    _Var2 = fd_is_valid(value);
    if (_Var2) {
      pnVar3 = nvpair_allocv(name,6,(ulong)(uint)value,8,0);
      if (pnVar3 == (nvpair_t *)0x0) {
        piVar4 = __errno_location();
        iVar1 = *piVar4;
        close(value);
        *piVar4 = iVar1;
        return (nvpair_t *)0x0;
      }
      return pnVar3;
    }
  }
  piVar4 = __errno_location();
  *piVar4 = 9;
  return (nvpair_t *)0x0;
}

Assistant:

nvpair_t *
nvpair_move_descriptor(const char *name, int value)
{
	nvpair_t *nvp;

	if (value < 0 || !fd_is_valid(value)) {
		ERRNO_SET(EBADF);
		return (NULL);
	}

	nvp = nvpair_allocv(name, NV_TYPE_DESCRIPTOR, (uint64_t)value,
	    sizeof(int64_t), 0);
	if (nvp == NULL) {
		ERRNO_SAVE();
		close(value);
		ERRNO_RESTORE();
	}

	return (nvp);
}